

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_1.cpp
# Opt level: O3

void __thiscall
ImporterStrict_sineCellml11Import_Test::~ImporterStrict_sineCellml11Import_Test
          (ImporterStrict_sineCellml11Import_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImporterStrict, sineCellml11Import)
{
    const std::vector<std::string> expectedImporterIssues = {
        "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0.",
        "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0.",
        "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0.",
    };
    const std::vector<std::string> expectedImporterIssueUrls = {
        "sin.xml",
        "deriv_approx_sin.xml",
        "parabolic_approx_sin.xml",
    };

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ImporterPtr importer = libcellml::Importer::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/sin_approximations_import.xml"));

    EXPECT_EQ(size_t(3), parser->issueCount());
    EXPECT_EQ_ISSUES(expectedParserIssues, parser);
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("cellml1X"));
    EXPECT_EQ(size_t(3), importer->issueCount());
    EXPECT_EQ_ISSUES(expectedImporterIssues, importer);
    EXPECT_EQ(importer->issueCount(), importer->messageCount());
    for (size_t i = 0; i < importer->messageCount(); ++i) {
        auto issue = importer->message(i);
        EXPECT_EQ(expectedImporterIssueUrls.at(i), issue->item()->importSource()->url());
    }
    EXPECT_FALSE(model->hasUnresolvedImports());
}